

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMUnaryOp.cpp
# Opt level: O1

void __thiscall xercesc_4_0::CMUnaryOp::calcFirstPos(CMUnaryOp *this,CMStateSet *toSet)

{
  CMNode *pCVar1;
  CMStateSet *this_00;
  
  pCVar1 = this->fChild;
  if (pCVar1->fFirstPos == (CMStateSet *)0x0) {
    this_00 = (CMStateSet *)XMemory::operator_new(0x20,pCVar1->fMemoryManager);
    CMStateSet::CMStateSet(this_00,(ulong)pCVar1->fMaxStates,pCVar1->fMemoryManager);
    pCVar1->fFirstPos = this_00;
    (*pCVar1->_vptr_CMNode[3])(pCVar1,this_00);
  }
  CMStateSet::operator=(toSet,pCVar1->fFirstPos);
  return;
}

Assistant:

void CMUnaryOp::calcFirstPos(CMStateSet& toSet) const
{
    // Its just based on our child node's first pos
    toSet = fChild->getFirstPos();
}